

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11disp.c
# Opt level: O2

X11Display * x11_setup_display(char *display,Conf *conf,char **error_msg)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  X11Display *display_00;
  X11Display *s;
  SockAddr *pSVar5;
  char *pcVar6;
  SockAddr *cmp;
  _STACK *p_Var7;
  long lVar8;
  char *__nptr;
  X11Display *pXVar9;
  X11Display *s_00;
  _Bool _Var10;
  
  display_00 = (X11Display *)safemalloc(1,0x50,0);
  *error_msg = (char *)0x0;
  if ((display == (char *)0x0) || (*display == '\0')) {
    s = (X11Display *)platform_get_x_display();
    if ((s == (X11Display *)0x0) || (cVar1 = s->unixdomain, (_Bool)cVar1 == false)) {
      safefree(s);
      display = ":0";
      goto LAB_0013f56a;
    }
  }
  else {
LAB_0013f56a:
    s = (X11Display *)dupstr(display);
    cVar1 = s->unixdomain;
  }
  if (cVar1 == '/') {
    display_00->unixsocketpath = &s->unixdomain;
    display_00->unixdomain = true;
    display_00->hostname = (char *)0x0;
    display_00->displaynum = -1;
    display_00->screennum = 0;
    display_00->addr = (SockAddr *)0x0;
  }
  else {
    pcVar6 = host_strrchr(&s->unixdomain,0x3a);
    if (pcVar6 == (char *)0x0) {
      pcVar6 = dupprintf("display name \'%s\' has no \':number\' suffix",s);
      *error_msg = pcVar6;
      safefree(display_00);
LAB_0013f7bc:
      safefree(s);
      return (X11Display *)0x0;
    }
    pXVar9 = (X11Display *)(pcVar6 + 1);
    *pcVar6 = '\0';
    pcVar6 = strchr((char *)pXVar9,0x2e);
    iVar4 = 0;
    if (pcVar6 == (char *)0x0) {
      __nptr = (char *)0x0;
    }
    else {
      __nptr = pcVar6 + 1;
      *pcVar6 = '\0';
    }
    iVar3 = atoi((char *)pXVar9);
    display_00->displaynum = iVar3;
    if (__nptr != (char *)0x0) {
      iVar4 = atoi(__nptr);
    }
    display_00->screennum = iVar4;
    if ((s < pXVar9) && (pcVar6 = strchr(&s->unixdomain,0x2f), pcVar6 != (char *)0x0)) {
      *pcVar6 = '\0';
      pXVar9 = s;
      s_00 = (X11Display *)(pcVar6 + 1);
    }
    else {
      pXVar9 = (X11Display *)0x0;
      s_00 = s;
    }
    if (s_00->unixdomain == false) {
      pcVar6 = (char *)0x0;
    }
    else {
      pcVar6 = dupstr(&s_00->unixdomain);
    }
    display_00->hostname = pcVar6;
    if (pXVar9 == (X11Display *)0x0) {
      if ((s_00->unixdomain == false) || (iVar4 = strcmp(&s_00->unixdomain,"unix"), iVar4 == 0)) {
        _Var10 = true;
      }
      else {
        _Var10 = false;
      }
    }
    else {
      iVar4 = strcmp(&pXVar9->unixdomain,"local");
      if (iVar4 == 0) {
        _Var10 = true;
      }
      else {
        iVar4 = strcmp(&pXVar9->unixdomain,"unix");
        _Var10 = iVar4 == 0;
      }
    }
    display_00->unixdomain = _Var10;
    if ((pcVar6 == (char *)0x0) && (_Var10 == false)) {
      pcVar6 = dupstr("localhost");
      display_00->hostname = pcVar6;
    }
    display_00->unixsocketpath = (char *)0x0;
    display_00->addr = (SockAddr *)0x0;
    safefree(s);
    bVar2 = display_00->unixdomain;
    if ((bVar2 & 1) == 0) {
      iVar4 = display_00->displaynum + 6000;
      display_00->port = iVar4;
      pSVar5 = name_lookup(display_00->hostname,iVar4,&display_00->realhost,conf,0,(LogContext *)0x0
                           ,(char *)0x0);
      display_00->addr = pSVar5;
      pcVar6 = sk_addr_error(pSVar5);
      if (pcVar6 != (char *)0x0) {
        pcVar6 = dupprintf("unable to resolve host name \'%s\' in display name",display_00->hostname
                          );
        *error_msg = pcVar6;
        sk_addr_free(display_00->addr);
        safefree(display_00->hostname);
        safefree(display_00->unixsocketpath);
        s = display_00;
        goto LAB_0013f7bc;
      }
      bVar2 = display_00->unixdomain;
    }
    if (((bVar2 & 1) == 0) && (_Var10 = sk_address_is_local(display_00->addr), _Var10)) {
      pSVar5 = platform_get_x11_unix_address((char *)0x0,display_00->displaynum);
      pcVar6 = sk_addr_error(pSVar5);
      if (pcVar6 == (char *)0x0) {
        cmp = sk_addr_dup(pSVar5);
        p_Var7 = sk_new((cmp *)cmp);
        lVar8 = (**(code **)(*(long *)p_Var7 + 0x30))(p_Var7);
        (**(code **)(*(long *)p_Var7 + 8))(p_Var7);
        if (lVar8 == 0) {
          sk_addr_free(display_00->addr);
          display_00->unixdomain = true;
          display_00->addr = pSVar5;
          goto LAB_0013f595;
        }
      }
      sk_addr_free(pSVar5);
    }
  }
LAB_0013f595:
  if (display_00->unixdomain == true) {
    if (display_00->addr == (SockAddr *)0x0) {
      pSVar5 = platform_get_x11_unix_address(display_00->unixsocketpath,display_00->displaynum);
      display_00->addr = pSVar5;
    }
    if (display_00->unixsocketpath == (char *)0x0) {
      pcVar6 = dupprintf("unix:%d",(ulong)(uint)display_00->displaynum);
    }
    else {
      pcVar6 = dupstr(display_00->unixsocketpath);
    }
    display_00->realhost = pcVar6;
    display_00->port = 0;
  }
  display_00->localauthproto = 0;
  display_00->localauthdata = (uchar *)0x0;
  display_00->localauthdatalen = 0;
  platform_get_x11_auth(display_00,conf);
  return display_00;
}

Assistant:

struct X11Display *x11_setup_display(const char *display, Conf *conf,
                                     char **error_msg)
{
    struct X11Display *disp = snew(struct X11Display);
    char *localcopy;

    *error_msg = NULL;

    if (!display || !*display) {
        localcopy = platform_get_x_display();
        if (!localcopy || !*localcopy) {
            sfree(localcopy);
            localcopy = dupstr(":0");  /* plausible default for any platform */
        }
    } else
        localcopy = dupstr(display);

    /*
     * Parse the display name.
     *
     * We expect this to have one of the following forms:
     *
     *  - the standard X format which looks like
     *    [ [ protocol '/' ] host ] ':' displaynumber [ '.' screennumber ]
     *    (X11 also permits a double colon to indicate DECnet, but
     *    that's not our problem, thankfully!)
     *
     *  - only seen in the wild on MacOS (so far): a pathname to a
     *    Unix-domain socket, which will typically and confusingly
     *    end in ":0", and which I'm currently distinguishing from
     *    the standard scheme by noting that it starts with '/'.
     */
    if (localcopy[0] == '/') {
        disp->unixsocketpath = localcopy;
        disp->unixdomain = true;
        disp->hostname = NULL;
        disp->displaynum = -1;
        disp->screennum = 0;
        disp->addr = NULL;
    } else {
        char *colon, *dot, *slash;
        char *protocol, *hostname;

        colon = host_strrchr(localcopy, ':');
        if (!colon) {
            *error_msg = dupprintf("display name '%s' has no ':number'"
                                   " suffix", localcopy);

            sfree(disp);
            sfree(localcopy);
            return NULL;
        }

        *colon++ = '\0';
        dot = strchr(colon, '.');
        if (dot)
            *dot++ = '\0';

        disp->displaynum = atoi(colon);
        if (dot)
            disp->screennum = atoi(dot);
        else
            disp->screennum = 0;

        protocol = NULL;
        hostname = localcopy;
        if (colon > localcopy) {
            slash = strchr(localcopy, '/');
            if (slash) {
                *slash++ = '\0';
                protocol = localcopy;
                hostname = slash;
            }
        }

        disp->hostname = *hostname ? dupstr(hostname) : NULL;

        if (protocol)
            disp->unixdomain = (!strcmp(protocol, "local") ||
                                !strcmp(protocol, "unix"));
        else if (!*hostname || !strcmp(hostname, "unix"))
            disp->unixdomain = platform_uses_x11_unix_by_default;
        else
            disp->unixdomain = false;

        if (!disp->hostname && !disp->unixdomain)
            disp->hostname = dupstr("localhost");

        disp->unixsocketpath = NULL;
        disp->addr = NULL;

        sfree(localcopy);
    }

    /*
     * Look up the display hostname, if we need to.
     */
    if (!disp->unixdomain) {
        const char *err;

        disp->port = 6000 + disp->displaynum;
        disp->addr = name_lookup(disp->hostname, disp->port,
                                 &disp->realhost, conf, ADDRTYPE_UNSPEC,
                                 NULL, NULL);

        if ((err = sk_addr_error(disp->addr)) != NULL) {
            *error_msg = dupprintf("unable to resolve host name '%s' in "
                                   "display name", disp->hostname);

            sk_addr_free(disp->addr);
            sfree(disp->hostname);
            sfree(disp->unixsocketpath);
            sfree(disp);
            return NULL;
        }
    }

    /*
     * Try upgrading an IP-style localhost display to a Unix-socket
     * display (as the standard X connection libraries do).
     */
    if (!disp->unixdomain && sk_address_is_local(disp->addr)) {
        SockAddr *ux = platform_get_x11_unix_address(NULL, disp->displaynum);
        const char *err = sk_addr_error(ux);
        if (!err) {
            /* Create trial connection to see if there is a useful Unix-domain
             * socket */
            Socket *s = sk_new(sk_addr_dup(ux), 0, false, false,
                               false, false, nullplug);
            err = sk_socket_error(s);
            sk_close(s);
        }
        if (err) {
            sk_addr_free(ux);
        } else {
            sk_addr_free(disp->addr);
            disp->unixdomain = true;
            disp->addr = ux;
            /* Fill in the rest in a moment */
        }
    }

    if (disp->unixdomain) {
        if (!disp->addr)
            disp->addr = platform_get_x11_unix_address(disp->unixsocketpath,
                                                       disp->displaynum);
        if (disp->unixsocketpath)
            disp->realhost = dupstr(disp->unixsocketpath);
        else
            disp->realhost = dupprintf("unix:%d", disp->displaynum);
        disp->port = 0;
    }

    /*
     * Fetch the local authorisation details.
     */
    disp->localauthproto = X11_NO_AUTH;
    disp->localauthdata = NULL;
    disp->localauthdatalen = 0;
    platform_get_x11_auth(disp, conf);

    return disp;
}